

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void not_equal_to_suite::compare_boolean_with_null(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_8d [17];
  nullable local_7c;
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_9;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_48,false);
  local_7c = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,&local_7c);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_9,&local_48,&local_78);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(false), null)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21d8,"void not_equal_to_suite::compare_boolean_with_null()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_c8,false);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_f8);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (local_8d,&local_c8,&local_f8);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(false), variable())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21d9,"void not_equal_to_suite::compare_boolean_with_null()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c8);
  return;
}

Assistant:

void compare_boolean_with_null()
{
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(false), null));
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(false), variable()));
}